

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_decoder.c
# Opt level: O0

lzma_ret decode_buffer(lzma_coder *coder,uint8_t *in,size_t *in_pos,size_t in_size,uint8_t *out,
                      size_t *out_pos,size_t out_size)

{
  size_t sVar1;
  lzma_ret lVar2;
  ulong __n;
  long local_68;
  size_t copy_size;
  lzma_ret ret;
  size_t dict_start;
  size_t *out_pos_local;
  uint8_t *out_local;
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_coder *coder_local;
  
  while( true ) {
    while( true ) {
      if ((coder->dict).pos == (coder->dict).size) {
        (coder->dict).pos = 0;
      }
      sVar1 = (coder->dict).pos;
      if (out_size - *out_pos < (coder->dict).size - (coder->dict).pos) {
        local_68 = out_size - *out_pos;
      }
      else {
        local_68 = (coder->dict).size - (coder->dict).pos;
      }
      (coder->dict).limit = (coder->dict).pos + local_68;
      lVar2 = (*(coder->lz).code)((coder->lz).coder,&coder->dict,in,in_pos,in_size);
      __n = (coder->dict).pos - sVar1;
      if (out_size - *out_pos < __n) {
        __assert_fail("copy_size <= out_size - *out_pos",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lz/lz_decoder.c"
                      ,0x60,
                      "lzma_ret decode_buffer(lzma_coder *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t)"
                     );
      }
      memcpy(out + *out_pos,(coder->dict).buf + sVar1,__n);
      *out_pos = __n + *out_pos;
      if (((coder->dict).need_reset & 1U) == 0) break;
      lz_decoder_reset(coder);
      if ((lVar2 != LZMA_OK) || (*out_pos == out_size)) {
        return lVar2;
      }
    }
    if (lVar2 != LZMA_OK) {
      return lVar2;
    }
    if (*out_pos == out_size) break;
    if ((coder->dict).pos < (coder->dict).size) {
      return LZMA_OK;
    }
  }
  return LZMA_OK;
}

Assistant:

static lzma_ret
decode_buffer(lzma_coder *coder,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size)
{
	while (true) {
		// Wrap the dictionary if needed.
		if (coder->dict.pos == coder->dict.size)
			coder->dict.pos = 0;

		// Store the current dictionary position. It is needed to know
		// where to start copying to the out[] buffer.
		const size_t dict_start = coder->dict.pos;

		// Calculate how much we allow coder->lz.code() to decode.
		// It must not decode past the end of the dictionary
		// buffer, and we don't want it to decode more than is
		// actually needed to fill the out[] buffer.
		coder->dict.limit = coder->dict.pos
				+ my_min(out_size - *out_pos,
					coder->dict.size - coder->dict.pos);

		// Call the coder->lz.code() to do the actual decoding.
		const lzma_ret ret = coder->lz.code(
				coder->lz.coder, &coder->dict,
				in, in_pos, in_size);

		// Copy the decoded data from the dictionary to the out[]
		// buffer.
		const size_t copy_size = coder->dict.pos - dict_start;
		assert(copy_size <= out_size - *out_pos);
		memcpy(out + *out_pos, coder->dict.buf + dict_start,
				copy_size);
		*out_pos += copy_size;

		// Reset the dictionary if so requested by coder->lz.code().
		if (coder->dict.need_reset) {
			lz_decoder_reset(coder);

			// Since we reset dictionary, we don't check if
			// dictionary became full.
			if (ret != LZMA_OK || *out_pos == out_size)
				return ret;
		} else {
			// Return if everything got decoded or an error
			// occurred, or if there's no more data to decode.
			//
			// Note that detecting if there's something to decode
			// is done by looking if dictionary become full
			// instead of looking if *in_pos == in_size. This
			// is because it is possible that all the input was
			// consumed already but some data is pending to be
			// written to the dictionary.
			if (ret != LZMA_OK || *out_pos == out_size
					|| coder->dict.pos < coder->dict.size)
				return ret;
		}
	}
}